

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall ymfm::ymf288::write_data_hi(ymf288 *this,uint8_t data)

{
  bool bVar1;
  uint32_t uVar2;
  ymfm_interface *pyVar3;
  uint local_24;
  int busy_cycles;
  uint8_t data_local;
  ymf288 *this_local;
  
  uVar2 = bitfield((uint)this->m_address,8,1);
  if (uVar2 != 0) {
    bVar1 = ymf288_mode(this);
    if (bVar1) {
      local_24 = 0x10;
    }
    else {
      uVar2 = fm_engine_base<ymfm::opn_registers_base<true>_>::clock_prescale
                        ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
      local_24 = uVar2 << 5;
    }
    if (this->m_address == 0x110) {
      uVar2 = bitfield((uint)data,7,1);
      if (uVar2 == 0) {
        this->m_flag_control = data;
        fm_engine_base<ymfm::opn_registers_base<true>_>::set_irq_mask
                  ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,
                   this->m_irq_enable & (this->m_flag_control ^ 0xff) & 3);
      }
      else {
        fm_engine_base<ymfm::opn_registers_base<true>_>::set_reset_status
                  ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,'\0',0xff);
      }
    }
    else {
      fm_engine_base<ymfm::opn_registers_base<true>_>::write
                ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,
                 (uint)this->m_address,(void *)(ulong)data,(ulong)local_24);
    }
    pyVar3 = fm_engine_base<ymfm::opn_registers_base<true>_>::intf
                       ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
    (*(code *)pyVar3->m_engine[3]._vptr_ymfm_engine_callbacks)(pyVar3,local_24);
  }
  return;
}

Assistant:

void ymf288::write_data_hi(uint8_t data)
{
	// ignore if paired with upper address
	if (!bitfield(m_address, 8))
		return;

	// wait times are shorter in YMF288 mode
	int busy_cycles = ymf288_mode() ? 16 : 32 * m_fm.clock_prescale();
	if (m_address == 0x110)
	{
		// 110: IRQ flag control
		if (bitfield(data, 7))
			m_fm.set_reset_status(0, 0xff);
		else
		{
			m_flag_control = data;
			m_fm.set_irq_mask(m_irq_enable & ~m_flag_control & 0x03);
		}
	}
	else
	{
		// 100-10F,111-1FF: write to FM
		m_fm.write(m_address, data);
	}

	// mark busy for a bit
	m_fm.intf().ymfm_set_busy_end(busy_cycles);
}